

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

char * Bbl_ManSortSop(char *pSop,int nVars)

{
  int iVar1;
  int nCubes_00;
  size_t sVar2;
  char **pCubes_00;
  int nCubes;
  int Length;
  int c;
  char *pSopNew;
  char **pCubes;
  int nVars_local;
  char *pSop_local;
  
  sVar2 = strlen(pSop);
  iVar1 = (int)sVar2;
  if (iVar1 % (nVars + 3) != 0) {
    __assert_fail("Length % (nVars + 3) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/bbl/bblif.c"
                  ,0x365,"char *Bbl_ManSortSop(char *, int)");
  }
  nCubes_00 = iVar1 / (nVars + 3);
  if (nCubes_00 < 2) {
    pSop_local = (char *)malloc((long)(iVar1 + 1));
    memcpy(pSop_local,pSop,(long)(iVar1 + 1));
  }
  else {
    pCubes_00 = (char **)malloc((long)nCubes_00 << 3);
    for (nCubes = 0; nCubes < nCubes_00; nCubes = nCubes + 1) {
      pCubes_00[nCubes] = pSop + nCubes * (nVars + 3);
    }
    if (nCubes_00 < 300) {
      Bbl_ManSortCubes(pCubes_00,nCubes_00,nVars);
    }
    pSop_local = (char *)malloc((long)(iVar1 + 1));
    for (nCubes = 0; nCubes < nCubes_00; nCubes = nCubes + 1) {
      memcpy(pSop_local + nCubes * (nVars + 3),pCubes_00[nCubes],(long)(nVars + 3));
    }
    if (pCubes_00 != (char **)0x0) {
      free(pCubes_00);
    }
    pSop_local[nCubes_00 * (nVars + 3)] = '\0';
  }
  return pSop_local;
}

Assistant:

char * Bbl_ManSortSop( char * pSop, int nVars )
{
    char ** pCubes, * pSopNew;
    int c, Length, nCubes;
    Length = strlen(pSop);
    assert( Length % (nVars + 3) == 0 );
    nCubes = Length / (nVars + 3);
    if ( nCubes < 2 )
    {
        pSopNew = BBLIF_ALLOC( char, Length + 1 );
        memcpy( pSopNew, pSop, Length + 1 );
        return pSopNew;
    }
    pCubes = BBLIF_ALLOC( char *, nCubes );
    for ( c = 0; c < nCubes; c++ )
        pCubes[c] = pSop + c * (nVars + 3);
    if ( nCubes < 300 )
        Bbl_ManSortCubes( pCubes, nCubes, nVars );
    pSopNew = BBLIF_ALLOC( char, Length + 1 );
    for ( c = 0; c < nCubes; c++ )
        memcpy( pSopNew + c * (nVars + 3), pCubes[c], nVars + 3 );
    BBLIF_FREE( pCubes );
    pSopNew[nCubes * (nVars + 3)] = 0;
    return pSopNew;
}